

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O0

JObject * __thiscall
pstack::JObject::field<char[5],pstack::Dwarf::Form,char>
          (JObject *this,char (*k) [5],Form *v,char *c)

{
  ostream *os;
  JSON<pstack::Field<char[5],_pstack::Dwarf::Form>,_char> local_48;
  undefined1 local_38 [8];
  Field<char[5],_pstack::Dwarf::Form> field;
  char *c_local;
  Form *v_local;
  char (*k_local) [5];
  JObject *this_local;
  
  field.v = (Form *)c;
  Field<char[5],_pstack::Dwarf::Form>::Field((Field<char[5],_pstack::Dwarf::Form> *)local_38,k,v);
  os = std::operator<<(this->os,this->sep);
  local_48 = json<pstack::Field<char[5],pstack::Dwarf::Form>,char>
                       ((Field<char[5],_pstack::Dwarf::Form> *)local_38,(char *)field.v);
  pstack::operator<<(os,&local_48);
  this->sep = ", ";
  return this;
}

Assistant:

JObject &field(const K &k, const V&v, const C &c = C()) {
         Field<K,V> field(k, v);
         os << sep << json(field, c);
         sep = ", ";
         return *this;
      }